

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O3

uint32_t testrand_int(uint32_t range)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  int *in_RSI;
  uint uVar7;
  undefined4 in_register_0000003c;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uint32_t uVar6;
  
  piVar8 = (int *)CONCAT44(in_register_0000003c,range);
  if (range == 0) {
    testrand_int_cold_1();
    uVar5 = 0;
    uVar6 = 0;
    if ((piVar8[0x38] == in_RSI[0x38]) && (*piVar8 == *in_RSI)) {
      secp256k1_scalar_verify((secp256k1_scalar *)(piVar8 + 2));
      secp256k1_scalar_verify((secp256k1_scalar *)(in_RSI + 2));
      if ((((*(long *)(piVar8 + 2) == *(long *)(in_RSI + 2)) &&
           ((((uVar5 = uVar6, *(long *)(piVar8 + 4) == *(long *)(in_RSI + 4) &&
              (*(long *)(piVar8 + 6) == *(long *)(in_RSI + 6))) &&
             (*(long *)(piVar8 + 8) == *(long *)(in_RSI + 8))) &&
            ((iVar2 = secp256k1_ge_eq_var((secp256k1_ge *)(piVar8 + 10),
                                          (secp256k1_ge *)(in_RSI + 10)), iVar2 != 0 &&
             (iVar2 = secp256k1_fe_equal((secp256k1_fe *)(piVar8 + 0x24),
                                         (secp256k1_fe *)(in_RSI + 0x24)), iVar2 != 0)))))) &&
          (*(long *)(piVar8 + 0x30) == *(long *)(in_RSI + 0x30))) &&
         ((*(long *)(piVar8 + 0x32) == *(long *)(in_RSI + 0x32) &&
          (*(long *)(piVar8 + 0x34) == *(long *)(in_RSI + 0x34))))) {
        uVar5 = (uint32_t)(*(long *)(piVar8 + 0x36) == *(long *)(in_RSI + 0x36));
      }
    }
    return uVar5;
  }
  uVar3 = 0;
  uVar7 = range - 1;
  uVar1 = uVar7;
  if (uVar7 != 0) {
    do {
      uVar3 = uVar3 * 2 + 1;
      bVar11 = 1 < uVar1;
      uVar1 = uVar1 >> 1;
    } while (bVar11);
  }
  do {
    uVar1 = ((int)(secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
            (uint)(secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29)) +
            (int)secp256k1_test_state[0] & uVar3;
    uVar10 = secp256k1_test_state[1] << 0x11;
    uVar4 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar9 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar4;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar9;
    secp256k1_test_state[2] = uVar4 ^ uVar10;
    secp256k1_test_state[3] = uVar9 << 0x2d | uVar9 >> 0x13;
  } while (uVar7 < uVar1);
  return uVar1;
}

Assistant:

static uint32_t testrand_int(uint32_t range) {
    uint32_t mask = 0;
    uint32_t range_copy;
    /* Reduce range by 1, changing its meaning to "maximum value". */
    VERIFY_CHECK(range != 0);
    range -= 1;
    /* Count the number of bits in range. */
    range_copy = range;
    while (range_copy) {
        mask = (mask << 1) | 1U;
        range_copy >>= 1;
    }
    /* Generation loop. */
    while (1) {
        uint32_t val = testrand64() & mask;
        if (val <= range) return val;
    }
}